

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O0

void __thiscall QualEngine::~QualEngine(QualEngine *this)

{
  int in_ESI;
  QualEngine *this_local;
  
  close(this,in_ESI);
  std::vector<char,_std::allocator<char>_>::~vector(&this->flowDirection);
  std::vector<int,_std::allocator<int>_>::~vector(&this->sortedLinks);
  return;
}

Assistant:

QualEngine::~QualEngine()
{
    close();

//    cout << "\nQualEngine destructed.\n";
}